

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscrollarea.cpp
# Opt level: O0

void __thiscall QScrollAreaPrivate::updateWidgetPosition(QScrollAreaPrivate *this)

{
  long lVar1;
  LayoutDirection LVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int ax;
  int iVar6;
  QSize *size;
  QScrollAreaPrivate *in_RDI;
  long in_FS_OFFSET;
  LayoutDirection dir;
  QScrollArea *q;
  QRect aligned;
  QRect scrolled;
  int in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff5c;
  LayoutDirection LVar7;
  QRect *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff70;
  LayoutDirection LVar8;
  LayoutDirection direction;
  QScrollAreaPrivate *pQVar9;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar9 = in_RDI;
  size = (QSize *)q_func(in_RDI);
  LVar8 = (LayoutDirection)((ulong)in_RDI >> 0x20);
  direction = (LayoutDirection)pQVar9;
  LVar2 = QWidget::layoutDirection((QWidget *)0x678a1f);
  LVar7 = LVar2;
  QWidget::rect((QWidget *)CONCAT44(in_stack_ffffffffffffff5c,LVar2));
  iVar3 = QAbstractSlider::value
                    ((QAbstractSlider *)
                     CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  iVar3 = -iVar3;
  QAbstractSlider::value
            ((QAbstractSlider *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  QPoint::QPoint((QPoint *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38);
  QPointer<QWidget>::operator->((QPointer<QWidget> *)0x678ac1);
  QWidget::size((QWidget *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  QRect::QRect(in_stack_ffffffffffffff60,(QPoint *)CONCAT44(in_stack_ffffffffffffff5c,LVar2),
               (QSize *)CONCAT44(iVar3,in_stack_ffffffffffffff50));
  QStyle::visualRect(LVar8,in_stack_ffffffffffffff60,
                     (QRect *)CONCAT44(in_stack_ffffffffffffff5c,LVar2));
  LVar8 = LVar7;
  QPointer<QWidget>::operator->((QPointer<QWidget> *)0x678b52);
  QWidget::size((QWidget *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  QWidget::rect((QWidget *)CONCAT44(LVar7,LVar2));
  QStyle::alignedRect(direction,(Alignment)0xaaaaaaaa,size,
                      (QRect *)CONCAT44(LVar8,in_stack_ffffffffffffff70));
  QPointer<QWidget>::operator->((QPointer<QWidget> *)0x678baf);
  QPointer<QWidget>::operator->((QPointer<QWidget> *)0x678bc5);
  iVar4 = QWidget::width((QWidget *)0x678bcd);
  iVar5 = QWidget::width((QWidget *)0x678be4);
  if (iVar4 < iVar5) {
    iVar4 = QRect::x((QRect *)0x678bf8);
  }
  else {
    iVar4 = QRect::x((QRect *)0x678c0b);
  }
  iVar5 = iVar4;
  QPointer<QWidget>::operator->((QPointer<QWidget> *)0x678c28);
  ax = QWidget::height((QWidget *)0x678c30);
  iVar6 = QWidget::height((QWidget *)0x678c47);
  if (ax < iVar6) {
    QRect::y((QRect *)0x678c5b);
  }
  else {
    QRect::y((QRect *)0x678c6e);
  }
  QWidget::move((QWidget *)CONCAT44(iVar3,iVar5),ax,iVar4);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QScrollAreaPrivate::updateWidgetPosition()
{
    Q_Q(QScrollArea);
    Qt::LayoutDirection dir = q->layoutDirection();
    QRect scrolled = QStyle::visualRect(dir, viewport->rect(), QRect(QPoint(-hbar->value(), -vbar->value()), widget->size()));
    QRect aligned = QStyle::alignedRect(dir, alignment, widget->size(), viewport->rect());
    widget->move(widget->width() < viewport->width() ? aligned.x() : scrolled.x(),
                 widget->height() < viewport->height() ? aligned.y() : scrolled.y());
}